

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

jx9_value * VmExtractMemObj(jx9_vm *pVm,SyString *pName,int bDup,int bCreate)

{
  VmFrame *pVVar1;
  sxi32 sVar2;
  SyHashEntry_Pr *pSVar3;
  char *pKey;
  SySet *pSet;
  byte bVar4;
  jx9_value *pjVar5;
  sxu32 nIdx;
  VmSlot sLocal;
  uint local_4c;
  SyHash *local_48;
  undefined1 local_40 [8];
  undefined8 local_38;
  
  if ((pName == (SyString *)0x0) || (pName->nByte == 0)) {
    pName = &VmExtractMemObj::sAnnon;
    bVar4 = 1;
    bDup = 0;
  }
  else {
    bVar4 = 0;
  }
  pVVar1 = pVm->pFrame;
  pSVar3 = (SyHashEntry_Pr *)0x0;
  if ((pName->nByte != 0) && ((pVm->hSuper).nEntry != 0)) {
    pSVar3 = HashGetEntry(&pVm->hSuper,pName->zString,pName->nByte);
  }
  if (pSVar3 == (SyHashEntry_Pr *)0x0) {
    local_48 = (SyHash *)CONCAT44(local_48._4_4_,bCreate);
    pSVar3 = (SyHashEntry_Pr *)0x0;
    if ((pName->nByte != 0) && ((pVVar1->hVar).nEntry != 0)) {
      pSVar3 = HashGetEntry(&pVVar1->hVar,pName->zString,pName->nByte);
    }
    if (pSVar3 != (SyHashEntry_Pr *)0x0) {
      local_4c = *(uint *)&pSVar3->pUserData;
      if (local_4c < (pVm->aMemObj).nUsed) {
        pjVar5 = (jx9_value *)
                 ((ulong)(local_4c * (pVm->aMemObj).eSize) + (long)(pVm->aMemObj).pBase);
      }
      else {
        pjVar5 = (jx9_value *)0x0;
      }
      if (!(bool)(bVar4 & pjVar5 != (jx9_value *)0x0)) {
        return pjVar5;
      }
      jx9MemObjRelease(pjVar5);
      return pjVar5;
    }
    if ((int)local_48 != 0) {
      pKey = pName->zString;
      local_48 = &pVVar1->hVar;
      pjVar5 = jx9VmReserveMemObj(pVm,&local_4c);
      if ((pjVar5 != (jx9_value *)0x0) &&
         ((bDup == 0 ||
          (pKey = SyMemBackendStrDup(&pVm->sAllocator,pName->zString,pName->nByte),
          pKey != (char *)0x0)))) {
        sVar2 = SyHashInsert(local_48,pKey,pName->nByte,(void *)(ulong)local_4c);
        if (sVar2 == 0) {
          if (pVVar1->pParent == (VmFrame *)0x0) {
            return pjVar5;
          }
          pSet = &pVVar1->sLocal;
        }
        else {
          local_38 = 0;
          pSet = &pVm->aFreeObj;
          pjVar5 = (jx9_value *)0x0;
        }
        SySetPut(pSet,local_40);
        return pjVar5;
      }
    }
  }
  else if (*(uint *)&pSVar3->pUserData < (pVm->aMemObj).nUsed) {
    return (jx9_value *)
           ((ulong)(*(uint *)&pSVar3->pUserData * (pVm->aMemObj).eSize) + (long)(pVm->aMemObj).pBase
           );
  }
  return (jx9_value *)0x0;
}

Assistant:

static jx9_value * VmExtractMemObj(
	jx9_vm *pVm,           /* Target VM */
	const SyString *pName, /* Variable name */
	int bDup,              /* True to duplicate variable name */
	int bCreate            /* True to create the variable if non-existent */
	)
{
	int bNullify = FALSE;
	SyHashEntry *pEntry;
	VmFrame *pFrame;
	jx9_value *pObj;
	sxu32 nIdx;
	sxi32 rc;
	/* Point to the top active frame */
	pFrame = pVm->pFrame;
	/* Perform the lookup */
	if( pName == 0 || pName->nByte < 1 ){
		static const SyString sAnnon = { " " , sizeof(char) };
		pName = &sAnnon;
		/* Always nullify the object */
		bNullify = TRUE;
		bDup = FALSE;
	}
	/* Check the superglobals table first */
	pEntry = SyHashGet(&pVm->hSuper, (const void *)pName->zString, pName->nByte);
	if( pEntry == 0 ){
		/* Query the top active frame */
		pEntry = SyHashGet(&pFrame->hVar, (const void *)pName->zString, pName->nByte);
		if( pEntry == 0 ){
			char *zName = (char *)pName->zString;
			VmSlot sLocal;
			if( !bCreate ){
				/* Do not create the variable, return NULL */
				return 0;
			}
			/* No such variable, automatically create a new one and install
			 * it in the current frame.
			 */
			pObj = jx9VmReserveMemObj(&(*pVm),&nIdx);
			if( pObj == 0 ){
				return 0;
			}
			if( bDup ){
				/* Duplicate name */
				zName = SyMemBackendStrDup(&pVm->sAllocator, pName->zString, pName->nByte);
				if( zName == 0 ){
					return 0;
				}
			}
			/* Link to the top active VM frame */
			rc = SyHashInsert(&pFrame->hVar, zName, pName->nByte, SX_INT_TO_PTR(nIdx));
			if( rc != SXRET_OK ){
				/* Return the slot to the free pool */
				sLocal.nIdx = nIdx;
				sLocal.pUserData = 0;
				SySetPut(&pVm->aFreeObj, (const void *)&sLocal);
				return 0;
			}
			if( pFrame->pParent != 0 ){
				/* Local variable */
				sLocal.nIdx = nIdx;
				SySetPut(&pFrame->sLocal, (const void *)&sLocal);
			}
		}else{
			/* Extract variable contents */
			nIdx = (sxu32)SX_PTR_TO_INT(pEntry->pUserData);
			pObj = (jx9_value *)SySetAt(&pVm->aMemObj, nIdx);
			if( bNullify && pObj ){
				jx9MemObjRelease(pObj);
			}
		}
	}else{
		/* Superglobal */
		nIdx = (sxu32)SX_PTR_TO_INT(pEntry->pUserData);
		pObj = (jx9_value *)SySetAt(&pVm->aMemObj, nIdx);
	}
	return pObj;
}